

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O0

ostream * red(ostream *s)

{
  ostream *s_local;
  
  return s;
}

Assistant:

inline std::ostream& red(std::ostream &s)
{
#ifdef WIN32
    HANDLE hStdout = GetStdHandle(STD_OUTPUT_HANDLE);
    SetConsoleTextAttribute(hStdout,
                            FOREGROUND_RED | FOREGROUND_INTENSITY);
#endif
    return s;
}